

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

pair<optional<Text>,_bool> * __thiscall
Patch::compute_old_text
          (pair<optional<Text>,_bool> *__return_storage_ptr__,Patch *this,
          optional<Text> *deleted_text,Point new_splice_start,Point new_deletion_end)

{
  TextSlice slice;
  TextSlice slice_00;
  TextSlice slice_01;
  bool bVar1;
  Point PVar2;
  Point *this_00;
  Point deleted_text_slice_start;
  TextSlice deleted_text_slice;
  vector<Patch::Change,_std::allocator<Patch::Change>_> overlapping_changes;
  Text result;
  pair<TextSlice,_TextSlice> split_result;
  Point local_130;
  TextSlice local_128;
  Point local_110;
  _Vector_base<Patch::Change,_std::allocator<Patch::Change>_> local_108;
  optional<Text> local_f0;
  TextSlice local_b0;
  Text local_98;
  pair<TextSlice,_TextSlice> local_60;
  
  if (deleted_text->is_some == false) {
    optional<Text>::optional(&local_f0);
    optional<Text>::optional(&__return_storage_ptr__->first,&local_f0);
    __return_storage_ptr__->second = true;
    Text::~Text(&local_f0.value);
  }
  else {
    Text::Text(&local_98);
    grab_changes_in_range<Patch::NewCoordinates>
              ((vector<Patch::Change,_std::allocator<Patch::Change>_> *)&local_108,this,
               new_splice_start,new_deletion_end,this->merges_adjacent_changes);
    TextSlice::TextSlice(&local_128,&deleted_text->value);
    this_00 = &(local_108._M_impl.super__Vector_impl_data._M_start)->new_start;
    local_130 = new_splice_start;
    do {
      if ((pointer)(this_00 + -2) == local_108._M_impl.super__Vector_impl_data._M_finish) {
        slice_01.start_position = local_128.start_position;
        slice_01.text = local_128.text;
        slice_01.end_position = local_128.end_position;
        Text::append(&local_98,slice_01);
        optional<Text>::optional(&__return_storage_ptr__->first,&local_98);
        __return_storage_ptr__->second = true;
        goto LAB_0015723d;
      }
      if (this_00[2] == (Point)0x0) {
        optional<Text>::optional(&local_f0);
        optional<Text>::optional(&__return_storage_ptr__->first,&local_f0);
        __return_storage_ptr__->second = true;
        goto LAB_00157232;
      }
      bVar1 = Point::operator>(this_00,&local_130);
      if (bVar1) {
        PVar2 = Point::traversal(this_00,&local_130);
        TextSlice::split(&local_60,&local_128,PVar2);
        bVar1 = TextSlice::is_valid(&local_60.first);
        if (!bVar1) {
          optional<Text>::optional(&local_f0);
          goto LAB_00157218;
        }
        local_130 = *this_00;
        local_128.text = local_60.second.text;
        local_128.start_position = local_60.second.start_position;
        local_128.end_position = local_60.second.end_position;
        slice.start_position = local_60.first.start_position;
        slice.text = local_60.first.text;
        slice.end_position = local_60.first.end_position;
        Text::append(&local_98,slice);
      }
      TextSlice::TextSlice(&local_b0,(Text *)this_00[2]);
      slice_00.start_position = local_b0.start_position;
      slice_00.text = local_b0.text;
      slice_00.end_position = local_b0.end_position;
      Text::append(&local_98,slice_00);
      local_60.first.text = (Text *)TextSlice::extent(&local_128);
      local_110 = Point::traversal(this_00 + 1,&local_130);
      PVar2 = Point::min((Point *)&local_60,&local_110);
      TextSlice::suffix((TextSlice *)&local_f0,&local_128,PVar2);
      local_128.end_position.row = local_f0.value.content.field_2._M_allocated_capacity._0_4_;
      local_128.end_position.column = local_f0.value.content.field_2._M_allocated_capacity._4_4_;
      local_128.text = (Text *)local_f0.value.content._M_dataplus._M_p;
      local_128.start_position.row = (undefined4)local_f0.value.content._M_string_length;
      local_128.start_position.column = local_f0.value.content._M_string_length._4_4_;
      local_130 = this_00[1];
      bVar1 = TextSlice::is_valid(&local_128);
      this_00 = this_00 + 8;
    } while (bVar1);
    optional<Text>::optional(&local_f0);
LAB_00157218:
    optional<Text>::optional(&__return_storage_ptr__->first,&local_f0);
    __return_storage_ptr__->second = false;
LAB_00157232:
    Text::~Text(&local_f0.value);
LAB_0015723d:
    std::_Vector_base<Patch::Change,_std::allocator<Patch::Change>_>::~_Vector_base(&local_108);
    Text::~Text(&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<optional<Text>, bool> Patch::compute_old_text(
  optional<Text> &&deleted_text, Point new_splice_start, Point new_deletion_end
) {
  if (!deleted_text) return {optional<Text>{}, true};

  Text result;

  auto overlapping_changes = grab_changes_in_range<NewCoordinates>(
    new_splice_start,
    new_deletion_end,
    merges_adjacent_changes
  );

  TextSlice deleted_text_slice = TextSlice(*deleted_text);
  Point deleted_text_slice_start = new_splice_start;

  for (const Change &change : overlapping_changes) {
    if (!change.old_text) return {optional<Text>{}, true};

    if (change.new_start > deleted_text_slice_start) {
      auto split_result = deleted_text_slice.split(
        change.new_start.traversal(deleted_text_slice_start)
      );
      if (!split_result.first.is_valid()) return {optional<Text>{}, false};
      deleted_text_slice_start = change.new_start;
      deleted_text_slice = split_result.second;
      result.append(split_result.first);
    }

    result.append(*change.old_text);
    deleted_text_slice = deleted_text_slice.suffix(Point::min(
      deleted_text_slice.extent(),
      change.new_end.traversal(deleted_text_slice_start)
    ));
    deleted_text_slice_start = change.new_end;

    if (!deleted_text_slice.is_valid()) return {optional<Text>{}, false};
  }

  result.append(deleted_text_slice);
  return {result, true};
}